

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterP.c
# Opt level: O2

Intp_Man_t * Intp_ManAlloc(void)

{
  Intp_Man_t *pIVar1;
  lit *plVar2;
  Vec_Ptr_t *pVVar3;
  
  pIVar1 = (Intp_Man_t *)calloc(1,0x98);
  pIVar1->nResLitsAlloc = 0x10000;
  plVar2 = (lit *)malloc(0x40000);
  pIVar1->pResLits = plVar2;
  pVVar3 = Vec_PtrAlloc(1000);
  pIVar1->vAntClas = pVVar3;
  pIVar1->fProofVerif = 1;
  return pIVar1;
}

Assistant:

Intp_Man_t * Intp_ManAlloc()
{
    Intp_Man_t * p;
    // allocate the manager
    p = (Intp_Man_t *)ABC_ALLOC( char, sizeof(Intp_Man_t) );
    memset( p, 0, sizeof(Intp_Man_t) );
    // verification
    p->nResLitsAlloc = (1<<16);
    p->pResLits = ABC_ALLOC( lit, p->nResLitsAlloc );
    // proof recording
//    p->vAnties = Vec_IntAlloc( 1000 );
//    p->vBreaks = Vec_IntAlloc( 1000 );
    p->vAntClas = Vec_PtrAlloc( 1000 );
    p->nAntStart = 0;
    // parameters
    p->fProofWrite = 0;
    p->fProofVerif = 1;
    return p;    
}